

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O0

bool __thiscall
cmGetPropertyCommand::InitialPass
          (cmGetPropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  ostream *poVar5;
  ulong uVar6;
  cmState *pcVar7;
  string *psVar8;
  char *pcVar9;
  cmPropertyDefinition *pcVar10;
  cmPropertyDefinition *def_1;
  string output_1;
  cmPropertyDefinition *def;
  string output;
  string local_3b8;
  string local_398;
  ostringstream local_378 [8];
  ostringstream e_1;
  uint local_200;
  int local_1fc;
  uint i;
  Doing doing;
  ostringstream local_1d8 [8];
  ostringstream e;
  ScopeType local_60;
  ScopeType scope;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_3_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmGetPropertyCommand *this_local;
  
  local_28 = param_2;
  param_3_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar3 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_004d3704;
  }
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_3_local,0);
  std::__cxx11::string::operator=((string *)&this->Variable,(string *)pvVar4);
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_3_local,1);
  bVar2 = std::operator==(pvVar4,"GLOBAL");
  if (bVar2) {
    local_60 = GLOBAL;
  }
  else {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_3_local,1);
    bVar2 = std::operator==(pvVar4,"DIRECTORY");
    if (bVar2) {
      local_60 = DIRECTORY;
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_3_local,1);
      bVar2 = std::operator==(pvVar4,"TARGET");
      if (bVar2) {
        local_60 = TARGET;
      }
      else {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_3_local,1);
        bVar2 = std::operator==(pvVar4,"SOURCE");
        if (bVar2) {
          local_60 = SOURCE_FILE;
        }
        else {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_3_local,1);
          bVar2 = std::operator==(pvVar4,"TEST");
          if (bVar2) {
            local_60 = TEST;
          }
          else {
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_3_local,1);
            bVar2 = std::operator==(pvVar4,"VARIABLE");
            if (bVar2) {
              local_60 = VARIABLE;
            }
            else {
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_3_local,1);
              bVar2 = std::operator==(pvVar4,"CACHE");
              if (bVar2) {
                local_60 = CACHE;
              }
              else {
                pvVar4 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)param_3_local,1);
                bVar2 = std::operator==(pvVar4,"INSTALL");
                if (!bVar2) {
                  std::__cxx11::ostringstream::ostringstream(local_1d8);
                  poVar5 = std::operator<<((ostream *)local_1d8,"given invalid scope ");
                  pvVar4 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)param_3_local,1);
                  poVar5 = std::operator<<(poVar5,(string *)pvVar4);
                  poVar5 = std::operator<<(poVar5,".  ");
                  poVar5 = std::operator<<(poVar5,"Valid scopes are ");
                  std::operator<<(poVar5,
                                  "GLOBAL, DIRECTORY, TARGET, SOURCE, TEST, VARIABLE, CACHE, INSTALL."
                                 );
                  std::__cxx11::ostringstream::str();
                  cmCommand::SetError(&this->super_cmCommand,(string *)&i);
                  std::__cxx11::string::~string((string *)&i);
                  this_local._7_1_ = 0;
                  std::__cxx11::ostringstream::~ostringstream(local_1d8);
                  goto LAB_004d3704;
                }
                local_60 = INSTALL;
              }
            }
          }
        }
      }
    }
  }
  local_1fc = 1;
  for (local_200 = 2;
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_3_local), local_200 < sVar3; local_200 = local_200 + 1) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_3_local,(ulong)local_200);
    bVar2 = std::operator==(pvVar4,"PROPERTY");
    if (bVar2) {
      local_1fc = 2;
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_3_local,(ulong)local_200);
      bVar2 = std::operator==(pvVar4,"BRIEF_DOCS");
      if (bVar2) {
        this->InfoType = OutBriefDoc;
      }
      else {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_3_local,(ulong)local_200);
        bVar2 = std::operator==(pvVar4,"FULL_DOCS");
        if (bVar2) {
          this->InfoType = OutFullDoc;
        }
        else {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_3_local,(ulong)local_200);
          bVar2 = std::operator==(pvVar4,"SET");
          if (bVar2) {
            this->InfoType = OutSet;
          }
          else {
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_3_local,(ulong)local_200);
            bVar2 = std::operator==(pvVar4,"DEFINED");
            if (bVar2) {
              this->InfoType = OutDefined;
            }
            else if (local_1fc == 1) {
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_3_local,(ulong)local_200);
              std::__cxx11::string::operator=((string *)&this->Name,(string *)pvVar4);
            }
            else {
              if (local_1fc != 2) {
                std::__cxx11::ostringstream::ostringstream(local_378);
                poVar5 = std::operator<<((ostream *)local_378,"given invalid argument \"");
                pvVar4 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)param_3_local,(ulong)local_200);
                poVar5 = std::operator<<(poVar5,(string *)pvVar4);
                std::operator<<(poVar5,"\".");
                std::__cxx11::ostringstream::str();
                cmCommand::SetError(&this->super_cmCommand,&local_398);
                std::__cxx11::string::~string((string *)&local_398);
                this_local._7_1_ = 0;
                std::__cxx11::ostringstream::~ostringstream(local_378);
                goto LAB_004d3704;
              }
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_3_local,(ulong)local_200);
              std::__cxx11::string::operator=((string *)&this->PropertyName,(string *)pvVar4);
            }
          }
        }
      }
      local_1fc = 0;
    }
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_3b8,"not given a PROPERTY <name> argument.",
               (allocator *)(output.field_2._M_local_buf + 0xf));
    cmCommand::SetError(&this->super_cmCommand,&local_3b8);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator((allocator<char> *)(output.field_2._M_local_buf + 0xf));
    this_local._7_1_ = 0;
    goto LAB_004d3704;
  }
  if (this->InfoType == OutBriefDoc) {
    std::__cxx11::string::string((string *)&def);
    pcVar7 = cmMakefile::GetState((this->super_cmCommand).Makefile);
    output_1.field_2._8_8_ = cmState::GetPropertyDefinition(pcVar7,&this->PropertyName,local_60);
    if ((cmPropertyDefinition *)output_1.field_2._8_8_ == (cmPropertyDefinition *)0x0) {
      std::__cxx11::string::operator=((string *)&def,"NOTFOUND");
    }
    else {
      psVar8 = cmPropertyDefinition::GetShortDescription_abi_cxx11_
                         ((cmPropertyDefinition *)output_1.field_2._8_8_);
      std::__cxx11::string::operator=((string *)&def,(string *)psVar8);
    }
    pcVar1 = (this->super_cmCommand).Makefile;
    pcVar9 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(pcVar1,&this->Variable,pcVar9);
    std::__cxx11::string::~string((string *)&def);
    goto switchD_004d365b_default;
  }
  if (this->InfoType == OutFullDoc) {
    std::__cxx11::string::string((string *)&def_1);
    pcVar7 = cmMakefile::GetState((this->super_cmCommand).Makefile);
    pcVar10 = cmState::GetPropertyDefinition(pcVar7,&this->PropertyName,local_60);
    if (pcVar10 == (cmPropertyDefinition *)0x0) {
      std::__cxx11::string::operator=((string *)&def_1,"NOTFOUND");
    }
    else {
      psVar8 = cmPropertyDefinition::GetFullDescription_abi_cxx11_(pcVar10);
      std::__cxx11::string::operator=((string *)&def_1,(string *)psVar8);
    }
    pcVar1 = (this->super_cmCommand).Makefile;
    pcVar9 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(pcVar1,&this->Variable,pcVar9);
    std::__cxx11::string::~string((string *)&def_1);
    goto switchD_004d365b_default;
  }
  if (this->InfoType == OutDefined) {
    pcVar7 = cmMakefile::GetState((this->super_cmCommand).Makefile);
    pcVar10 = cmState::GetPropertyDefinition(pcVar7,&this->PropertyName,local_60);
    if (pcVar10 == (cmPropertyDefinition *)0x0) {
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&this->Variable,"0");
    }
    else {
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&this->Variable,"1");
    }
    goto switchD_004d365b_default;
  }
  switch(local_60) {
  case TARGET:
    this_local._7_1_ = HandleTargetMode(this);
    break;
  case SOURCE_FILE:
    this_local._7_1_ = HandleSourceMode(this);
    break;
  case DIRECTORY:
    this_local._7_1_ = HandleDirectoryMode(this);
    break;
  case GLOBAL:
    this_local._7_1_ = HandleGlobalMode(this);
    break;
  case CACHE:
    this_local._7_1_ = HandleCacheMode(this);
    break;
  case TEST:
    this_local._7_1_ = HandleTestMode(this);
    break;
  case VARIABLE:
    this_local._7_1_ = HandleVariableMode(this);
    break;
  case CACHED_VARIABLE:
  default:
switchD_004d365b_default:
    this_local._7_1_ = 1;
    break;
  case INSTALL:
    this_local._7_1_ = HandleInstallMode(this);
  }
LAB_004d3704:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGetPropertyCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 3 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // The cmake variable in which to store the result.
  this->Variable = args[0];

  // Get the scope from which to get the property.
  cmProperty::ScopeType scope;
  if(args[1] == "GLOBAL")
    {
    scope = cmProperty::GLOBAL;
    }
  else if(args[1] == "DIRECTORY")
    {
    scope = cmProperty::DIRECTORY;
    }
  else if(args[1] == "TARGET")
    {
    scope = cmProperty::TARGET;
    }
  else if(args[1] == "SOURCE")
    {
    scope = cmProperty::SOURCE_FILE;
    }
  else if(args[1] == "TEST")
    {
    scope = cmProperty::TEST;
    }
  else if(args[1] == "VARIABLE")
    {
    scope = cmProperty::VARIABLE;
    }
  else if(args[1] == "CACHE")
    {
    scope = cmProperty::CACHE;
    }
  else if(args[1] == "INSTALL")
    {
    scope = cmProperty::INSTALL;
    }
  else
    {
    std::ostringstream e;
    e << "given invalid scope " << args[1] << ".  "
      << "Valid scopes are "
      << "GLOBAL, DIRECTORY, TARGET, SOURCE, TEST, VARIABLE, CACHE, INSTALL.";
    this->SetError(e.str());
    return false;
    }

  // Parse remaining arguments.
  enum Doing { DoingNone, DoingName, DoingProperty, DoingType };
  Doing doing = DoingName;
  for(unsigned int i=2; i < args.size(); ++i)
    {
    if(args[i] == "PROPERTY")
      {
      doing = DoingProperty;
      }
    else if(args[i] == "BRIEF_DOCS")
      {
      doing = DoingNone;
      this->InfoType = OutBriefDoc;
      }
    else if(args[i] == "FULL_DOCS")
      {
      doing = DoingNone;
      this->InfoType = OutFullDoc;
      }
    else if(args[i] == "SET")
      {
      doing = DoingNone;
      this->InfoType = OutSet;
      }
    else if(args[i] == "DEFINED")
      {
      doing = DoingNone;
      this->InfoType = OutDefined;
      }
    else if(doing == DoingName)
      {
      doing = DoingNone;
      this->Name = args[i];
      }
    else if(doing == DoingProperty)
      {
      doing = DoingNone;
      this->PropertyName = args[i];
      }
    else
      {
      std::ostringstream e;
      e << "given invalid argument \"" << args[i] << "\".";
      this->SetError(e.str());
      return false;
      }
    }

  // Make sure a property name was found.
  if(this->PropertyName.empty())
    {
    this->SetError("not given a PROPERTY <name> argument.");
    return false;
    }

  // Compute requested output.
  if(this->InfoType == OutBriefDoc)
    {
    // Lookup brief documentation.
    std::string output;
    if(cmPropertyDefinition const* def = this->Makefile->GetState()->
       GetPropertyDefinition(this->PropertyName, scope))
      {
      output = def->GetShortDescription();
      }
    else
      {
      output = "NOTFOUND";
      }
    this->Makefile->AddDefinition(this->Variable, output.c_str());
    }
  else if(this->InfoType == OutFullDoc)
    {
    // Lookup full documentation.
    std::string output;
    if(cmPropertyDefinition const* def = this->Makefile->GetState()->
       GetPropertyDefinition(this->PropertyName, scope))
      {
      output = def->GetFullDescription();
      }
    else
      {
      output = "NOTFOUND";
      }
    this->Makefile->AddDefinition(this->Variable, output.c_str());
    }
  else if(this->InfoType == OutDefined)
    {
    // Lookup if the property is defined
    if(this->Makefile->GetState()->
       GetPropertyDefinition(this->PropertyName, scope))
      {
      this->Makefile->AddDefinition(this->Variable, "1");
      }
    else
      {
      this->Makefile->AddDefinition(this->Variable, "0");
      }
    }
  else
    {
    // Dispatch property getting.
    switch(scope)
      {
      case cmProperty::GLOBAL:      return this->HandleGlobalMode();
      case cmProperty::DIRECTORY:   return this->HandleDirectoryMode();
      case cmProperty::TARGET:      return this->HandleTargetMode();
      case cmProperty::SOURCE_FILE: return this->HandleSourceMode();
      case cmProperty::TEST:        return this->HandleTestMode();
      case cmProperty::VARIABLE:    return this->HandleVariableMode();
      case cmProperty::CACHE:       return this->HandleCacheMode();
      case cmProperty::INSTALL:       return this->HandleInstallMode();

      case cmProperty::CACHED_VARIABLE:
        break; // should never happen
      }
    }

  return true;
}